

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O3

int SUNQRAdd_ICWY(N_Vector *Q,realtype *R,N_Vector df,int m,int mMax,void *QRdata)

{
  realtype *dotprods;
  int iVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  realtype *prVar6;
  ulong uVar7;
  ulong uVar8;
  double *pdVar9;
  ulong uVar10;
  realtype rVar11;
  double dVar12;
  
  N_VScale(1.0,df,*QRdata);
  if (0 < m) {
    iVar1 = (m - 1U) * mMax;
    N_VDotProdMulti(m,Q[m - 1U],Q,(realtype *)((long)iVar1 * 8 + *(long *)((long)QRdata + 0x10)));
    *(undefined8 *)(*(long *)((long)QRdata + 0x10) + (long)(iVar1 + m + -1) * 8) =
         0x3ff0000000000000;
    dotprods = R + mMax * m;
    N_VDotProdMulti(m,*QRdata,Q,dotprods);
    lVar2 = (long)mMax;
    uVar4 = (ulong)(uint)m;
    lVar3 = lVar2 * 8;
    uVar5 = uVar4;
    prVar6 = dotprods;
    uVar7 = 0;
    do {
      uVar8 = uVar7 + 1;
      if (uVar8 < uVar4) {
        pdVar9 = (double *)(*(long *)((long)QRdata + 0x10) + lVar3);
        uVar10 = 1;
        do {
          prVar6[uVar10] = prVar6[uVar10] - dotprods[uVar7] * *pdVar9;
          uVar10 = uVar10 + 1;
          pdVar9 = pdVar9 + lVar2;
        } while (uVar5 != uVar10);
      }
      prVar6 = prVar6 + 1;
      lVar3 = lVar3 + lVar2 * 8 + 8;
      uVar5 = uVar5 - 1;
      uVar7 = uVar8;
    } while (uVar8 != uVar4);
    N_VLinearCombination(m,dotprods,Q,*(N_Vector *)((long)QRdata + 8));
    N_VLinearSum(1.0,*QRdata,-1.0,*(N_Vector *)((long)QRdata + 8),*QRdata);
  }
  rVar11 = N_VDotProd(*QRdata,*QRdata);
  dVar12 = 0.0;
  if (0.0 < rVar11) {
    rVar11 = N_VDotProd(*QRdata,*QRdata);
    if (rVar11 < 0.0) {
      dVar12 = sqrt(rVar11);
    }
    else {
      dVar12 = SQRT(rVar11);
    }
  }
  R[(mMax + 1) * m] = dVar12;
  N_VScale(1.0 / dVar12,*QRdata,Q[m]);
  return 0;
}

Assistant:

int SUNQRAdd_ICWY(N_Vector *Q, realtype *R, N_Vector df,
                  int m, int mMax, void *QRdata)
{
    sunindextype j, k;
    SUNQRData qrdata = (SUNQRData) QRdata;

    N_VScale(ONE, df, qrdata->vtemp); /* stores d_fi in temp */

    if (m > 0) {
      /* T(1:k-1,k-1)^T = Q(:,1:k-1)^T * Q(:,k-1) */
      N_VDotProdMulti(m, Q[m-1], Q, qrdata->temp_array + (m-1) * mMax);

      /* T(k-1,k-1) = 1.0 */
      qrdata->temp_array[(m-1) * mMax + (m-1)] = ONE;

      /* R(1:k-1,k) = Q_k-1^T * df */
      N_VDotProdMulti(m, qrdata->vtemp, Q, R + m * mMax );

      /* Solve T^T * R(1:k-1,k) = R(1:k-1,k) */
      for (k = 0; k < m; k++) {
        /* Skip setting the diagonal element because it doesn't change */
        for (j = k+1; j < m; j++) {
          R[m * mMax + j] -= R[m * mMax + k] * qrdata->temp_array[j * mMax + k];
        }
      }
      /* end */

      /* Q(:,k-1) = df - Q_k-1 R(1:k-1,k) */
      N_VLinearCombination(m, R + m * mMax, Q, qrdata->vtemp2);
      N_VLinearSum(ONE, qrdata->vtemp, -ONE, qrdata->vtemp2, qrdata->vtemp);
    }

    /* R(k,k) = \| df \| */
    R[m * mMax + m] = SUNRsqrt(N_VDotProd(qrdata->vtemp, qrdata->vtemp));
    /* Q(:,k) = df / \| df \| */
    N_VScale((1/R[m * mMax + m]), qrdata->vtemp, Q[m]);

    /* Return success */
    return 0;
}